

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  bool bVar1;
  int iVar2;
  cTValue *o1_00;
  cTValue *o2_00;
  undefined4 extraout_var;
  TValue *pTVar3;
  ulong uVar4;
  code *pcVar5;
  
  pTVar3 = (o1->th).base;
  if ((pTVar3 == (TValue *)0x0) || ((*(uint8_t *)((long)pTVar3 + 10) & 0x10) != 0)) {
LAB_001191a1:
    o1_00 = (cTValue *)0x0;
  }
  else {
    o1_00 = lj_tab_getstr((GCtab *)&pTVar3->gcr,*(GCstr **)((L->glref).ptr64 + 0x1c8));
    if ((o1_00 == (cTValue *)0x0) || (o1_00->u64 == 0xffffffffffffffff)) {
      *(uint8_t *)((long)pTVar3 + 10) = *(uint8_t *)((long)pTVar3 + 10) | 0x10;
      goto LAB_001191a1;
    }
  }
  if (o1_00 == (cTValue *)0x0) {
    return (TValue *)(long)ne;
  }
  pTVar3 = (o2->th).base;
  if ((o1->th).base == pTVar3) goto LAB_0011920a;
  if ((pTVar3 == (TValue *)0x0) || ((*(uint8_t *)((long)pTVar3 + 10) & 0x10) != 0)) {
LAB_001191e5:
    o2_00 = (cTValue *)0x0;
  }
  else {
    o2_00 = lj_tab_getstr((GCtab *)&pTVar3->gcr,*(GCstr **)((L->glref).ptr64 + 0x1c8));
    if ((o2_00 == (cTValue *)0x0) || (o2_00->u64 == 0xffffffffffffffff)) {
      *(uint8_t *)((long)pTVar3 + 10) = *(uint8_t *)((long)pTVar3 + 10) | 0x10;
      goto LAB_001191e5;
    }
  }
  if (o2_00 == (cTValue *)0x0) {
LAB_00119201:
    pTVar3 = (TValue *)(long)ne;
    bVar1 = false;
  }
  else {
    iVar2 = lj_obj_equal(o1_00,o2_00);
    pTVar3 = (TValue *)CONCAT44(extraout_var,iVar2);
    if (iVar2 == 0) goto LAB_00119201;
    bVar1 = true;
  }
  if (!bVar1) {
    return pTVar3;
  }
LAB_0011920a:
  uVar4 = L->base[-2].u64 & 0x7fffffffffff;
  if (*(char *)(uVar4 + 10) == '\0') {
    pTVar3 = L->base + *(byte *)(*(long *)(uVar4 + 0x20) + -0x5d);
  }
  else {
    pTVar3 = L->top;
  }
  pcVar5 = lj_cont_condf;
  if (ne == 0) {
    pcVar5 = lj_cont_condt;
  }
  pTVar3->n = (lua_Number)pcVar5;
  pTVar3[1].u64 = 0xffffffffffffffff;
  pTVar3[2] = *o1_00;
  pTVar3[3].u64 = 0xffffffffffffffff;
  uVar4 = (ulong)~(uint)(o1->gch).gct << 0x2f;
  pTVar3[4].u64 = (ulong)o1 | uVar4;
  pTVar3[5].u64 = uVar4 | (ulong)o2;
  return pTVar3 + 4;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top++, ne ? lj_cont_condf : lj_cont_condt);
    if (LJ_FR2) setnilV(top++);
    copyTV(L, top++, mo);
    if (LJ_FR2) setnilV(top++);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top, o1, it);
    setgcV(L, top+1, o2, it);
    return top;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}